

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O0

int xmlXPtrSearchString(xmlChar *string,xmlNodePtr *start,int *startindex,xmlNodePtr *end,
                       int *endindex)

{
  xmlChar val;
  int iVar1;
  int iVar2;
  xmlChar *pxVar3;
  int iStack_4c;
  xmlChar first;
  int len;
  int pos;
  xmlChar *str;
  xmlNodePtr cur;
  int *endindex_local;
  xmlNodePtr *end_local;
  int *startindex_local;
  xmlNodePtr *start_local;
  xmlChar *string_local;
  
  if (string == (xmlChar *)0x0) {
    string_local._4_4_ = -1;
  }
  else if ((((start == (xmlNodePtr *)0x0) || (*start == (xmlNodePtr)0x0)) ||
           ((*start)->type == XML_NAMESPACE_DECL)) || (startindex == (int *)0x0)) {
    string_local._4_4_ = -1;
  }
  else if ((end == (xmlNodePtr *)0x0) || (endindex == (int *)0x0)) {
    string_local._4_4_ = -1;
  }
  else {
    str = (xmlChar *)*start;
    iStack_4c = *startindex + -1;
    val = *string;
    while (str != (xmlChar *)0x0) {
      if ((*(int *)(str + 8) != 1) && (*(long *)(str + 0x50) != 0)) {
        iVar1 = xmlStrlen(*(xmlChar **)(str + 0x50));
        for (; iStack_4c <= iVar1; iStack_4c = iStack_4c + 1) {
          if (val == '\0') {
            *start = (xmlNodePtr)str;
            *startindex = iStack_4c + 1;
            *end = (xmlNodePtr)str;
            *endindex = iStack_4c + 1;
            return 1;
          }
          pxVar3 = xmlStrchr((xmlChar *)(*(long *)(str + 0x50) + (long)iStack_4c),val);
          iStack_4c = iVar1;
          if (pxVar3 != (xmlChar *)0x0) {
            iStack_4c = (int)pxVar3 - (int)*(undefined8 *)(str + 0x50);
            iVar2 = xmlXPtrMatchString(string,(xmlNodePtr)str,iStack_4c + 1,end,endindex);
            if (iVar2 != 0) {
              *start = (xmlNodePtr)str;
              *startindex = iStack_4c + 1;
              return 1;
            }
          }
        }
      }
      if (((xmlNodePtr)str == *end) && (*endindex <= iStack_4c)) {
        return 0;
      }
      str = (xmlChar *)xmlXPtrAdvanceNode((xmlNodePtr)str,(int *)0x0);
      if ((xmlNodePtr)str == (xmlNodePtr)0x0) {
        return 0;
      }
      iStack_4c = 1;
    }
    string_local._4_4_ = 0;
  }
  return string_local._4_4_;
}

Assistant:

static int
xmlXPtrSearchString(const xmlChar *string, xmlNodePtr *start, int *startindex,
	            xmlNodePtr *end, int *endindex) {
    xmlNodePtr cur;
    const xmlChar *str;
    int pos; /* 0 based */
    int len; /* in bytes */
    xmlChar first;

    if (string == NULL)
	return(-1);
    if ((start == NULL) || (*start == NULL) ||
        ((*start)->type == XML_NAMESPACE_DECL) || (startindex == NULL))
	return(-1);
    if ((end == NULL) || (endindex == NULL))
	return(-1);
    cur = *start;
    pos = *startindex - 1;
    first = string[0];

    while (cur != NULL) {
	if ((cur->type != XML_ELEMENT_NODE) && (cur->content != NULL)) {
	    len = xmlStrlen(cur->content);
	    while (pos <= len) {
		if (first != 0) {
		    str = xmlStrchr(&cur->content[pos], first);
		    if (str != NULL) {
			pos = (str - (xmlChar *)(cur->content));
#ifdef DEBUG_RANGES
			xmlGenericError(xmlGenericErrorContext,
				"found '%c' at index %d of ->",
				first, pos + 1);
			xmlDebugDumpString(stdout, cur->content);
			xmlGenericError(xmlGenericErrorContext, "\n");
#endif
			if (xmlXPtrMatchString(string, cur, pos + 1,
					       end, endindex)) {
			    *start = cur;
			    *startindex = pos + 1;
			    return(1);
			}
			pos++;
		    } else {
			pos = len + 1;
		    }
		} else {
		    /*
		     * An empty string is considered to match before each
		     * character of the string-value and after the final
		     * character.
		     */
#ifdef DEBUG_RANGES
		    xmlGenericError(xmlGenericErrorContext,
			    "found '' at index %d of ->",
			    pos + 1);
		    xmlDebugDumpString(stdout, cur->content);
		    xmlGenericError(xmlGenericErrorContext, "\n");
#endif
		    *start = cur;
		    *startindex = pos + 1;
		    *end = cur;
		    *endindex = pos + 1;
		    return(1);
		}
	    }
	}
	if ((cur == *end) && (pos >= *endindex))
	    return(0);
	cur = xmlXPtrAdvanceNode(cur, NULL);
	if (cur == NULL)
	    return(0);
	pos = 1;
    }
    return(0);
}